

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O0

bool __thiscall
dlib::
binary_search_tree_kernel_2<unsigned_long,_char,_dlib::memory_manager_kernel_2<char,_100UL>,_std::less<unsigned_long>_>
::remove_least_element_in_tree
          (binary_search_tree_kernel_2<unsigned_long,_char,_dlib::memory_manager_kernel_2<char,_100UL>,_std::less<unsigned_long>_>
           *this,node *t,unsigned_long *d,char *r)

{
  binary_search_tree_kernel_2<unsigned_long,_char,_dlib::memory_manager_kernel_2<char,_100UL>,_std::less<unsigned_long>_>
  *in_RCX;
  node *in_RSI;
  unsigned_long *in_RDI;
  bool rvalue;
  node *child;
  node *next;
  unsigned_long *in_stack_ffffffffffffffb8;
  node *local_30;
  node *pnVar1;
  node *local_10;
  
  pnVar1 = in_RSI->left;
  if (pnVar1 == (node *)in_RDI[6]) {
    if (in_RSI->parent->left == in_RSI) {
      local_30 = in_RSI->right;
      in_RSI->parent->left = local_30;
    }
    else {
      local_30 = in_RSI->right;
      in_RSI->parent->right = local_30;
    }
    local_10 = in_RSI;
    if (in_RSI == (node *)in_RDI[8]) {
      in_RDI[8] = (unsigned_long)local_30;
    }
  }
  else {
    do {
      local_10 = pnVar1;
      pnVar1 = local_10->left;
    } while (pnVar1 != (node *)in_RDI[6]);
    local_30 = local_10->right;
    local_10->parent->left = local_30;
  }
  exchange<unsigned_long>(in_RDI,in_stack_ffffffffffffffb8);
  exchange<char>((char *)in_RDI,(char *)in_stack_ffffffffffffffb8);
  local_30->parent = local_10->parent;
  if (local_10->color == '\x01') {
    fix_after_remove(in_RCX,pnVar1);
  }
  pnVar1 = (node *)in_RDI[9];
  memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<unsigned_long,_char,_dlib::memory_manager_kernel_2<char,_100UL>,_std::less<unsigned_long>_>::node,_100UL>
  ::deallocate((memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<unsigned_long,_char,_dlib::memory_manager_kernel_2<char,_100UL>,_std::less<unsigned_long>_>::node,_100UL>
                *)(in_RDI + 2),local_10);
  return local_10 == pnVar1;
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    remove_least_element_in_tree (
        node* t,
        domain& d,
        range& r
    ) 
    {

        node* next = t->left;
        node* child;  // the child node of the one we will slice out

        if (next == NIL)
        {
            // need to determine if t is a left or right child
            if (t->parent->left == t)
                child = t->parent->left = t->right;
            else
                child = t->parent->right = t->right;

            // update tree_root if necessary
            if (t == tree_root)
                tree_root = child;
        }
        else
        {
            // find the least node
            do 
            {
                t = next;
                next = next->left;
            } while (next != NIL);
            // t is a left child
            child = t->parent->left = t->right;

        }
        
        // swap the item from this node into d and r
        exchange(d,t->d);
        exchange(r,t->r);

        // plug hole left by removing this node
        child->parent = t->parent;

        // keep the red-black properties true
        if (t->color == black)
            fix_after_remove(child);

        bool rvalue = (t == current_element);
        // free the memory for this removed node
        pool.deallocate(t);        
        return rvalue;
    }